

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O0

void unlink_dep(nghttp2_stream *stream)

{
  nghttp2_stream *pnVar1;
  nghttp2_stream *pnVar2;
  nghttp2_stream *dep_next;
  nghttp2_stream *next;
  nghttp2_stream *prev;
  nghttp2_stream *stream_local;
  
  pnVar2 = stream->dep_prev;
  pnVar1 = stream->dep_next;
  if (pnVar2 == (nghttp2_stream *)0x0) {
    __assert_fail("prev",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_stream.c"
                  ,0x2d1,"void unlink_dep(nghttp2_stream *)");
  }
  if (pnVar1 == (nghttp2_stream *)0x0) {
    if (stream->sib_next == (nghttp2_stream *)0x0) {
      pnVar2->dep_next = (nghttp2_stream *)0x0;
    }
    else {
      pnVar1 = stream->sib_next;
      pnVar1->sib_prev = (nghttp2_stream *)0x0;
      link_dep(pnVar2,pnVar1);
    }
  }
  else {
    link_dep(pnVar2,pnVar1);
    set_dep_prev(pnVar1,stream->dep_prev);
    if (stream->sib_next != (nghttp2_stream *)0x0) {
      pnVar2 = stream_last_sib(pnVar1);
      link_sib(pnVar2,stream->sib_next);
    }
  }
  return;
}

Assistant:

static void unlink_dep(nghttp2_stream *stream) {
  nghttp2_stream *prev, *next, *dep_next;

  prev = stream->dep_prev;
  dep_next = stream->dep_next;

  assert(prev);

  if (dep_next) {
    /*
     * prev
     *   |
     * stream(--sib_next--...)
     *   |
     * dep_next
     */
    link_dep(prev, dep_next);

    set_dep_prev(dep_next, stream->dep_prev);

    if (stream->sib_next) {
      link_sib(stream_last_sib(dep_next), stream->sib_next);
    }

  } else if (stream->sib_next) {
    /*
     * prev
     *   |
     * stream--sib_next
     */
    next = stream->sib_next;

    next->sib_prev = NULL;

    link_dep(prev, next);
  } else {
    prev->dep_next = NULL;
  }
}